

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O1

TlvPtr __thiscall
ot::commissioner::tlv::Tlv::Deserialize
          (Tlv *this,Error *aError,size_t *aOffset,ByteArray *aBuf,Scope aScope)

{
  byte bVar1;
  ulong uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  char *pcVar4;
  Tlv *__tmp;
  ulong uVar5;
  char *pcVar6;
  pointer puVar7;
  type atVar8 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  ulong uVar10;
  pointer puVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  bool bVar15;
  TlvPtr TVar16;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  Error error;
  writer write;
  string local_f8;
  ulong local_d8;
  ErrorCode local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  ErrorCode local_a8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  ulong *local_80;
  Error *local_78;
  writer local_70;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  local_d0 = kNone;
  local_c8 = local_b8;
  local_c0 = 0;
  local_b8[0] = 0;
  uVar2 = *aOffset;
  this->mScope = kMeshCoP;
  this->mType = kChannel;
  *(undefined6 *)&this->field_0x2 = 0;
  (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  uVar12 = uVar2 + 2;
  puVar7 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar7;
  local_80 = aOffset;
  local_78 = aError;
  if (uVar5 < uVar12) {
    local_68.types_ = (type  [2])((ulong)local_68.types_[1] << 0x20);
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "premature end of TLV";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x14;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    pcVar13 = "premature end of TLV";
    local_68.context_.types_ = local_68.types_;
    do {
      pcVar6 = pcVar13 + 1;
      if (*pcVar13 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar13 + 2;
      }
      else if (*pcVar13 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar13,"",(format_string_checker<char> *)&local_68);
      }
      pcVar13 = pcVar6;
    } while (pcVar6 != "");
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_f8,(v10 *)"premature end of TLV",(string_view)ZEXT816(0x14),args);
    local_a8 = kBadFormat;
    local_a0[0] = local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,local_f8._M_dataplus._M_p,
               local_f8._M_dataplus._M_p + local_f8._M_string_length);
    uVar12 = uVar2;
  }
  else {
    bVar1 = puVar7[uVar2];
    atVar8._1_7_ = 0;
    atVar8[0]._0_1_ = bVar1;
    uVar10 = (ulong)puVar7[uVar2 + 1];
    uVar14 = uVar12;
    if (uVar10 == 0xff) {
      uVar14 = uVar2 + 4;
      if (uVar5 < uVar14) {
        local_68.types_[0] = uint_type;
        pcVar13 = "premature end of Extended TLV(type={})";
        local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "premature end of Extended TLV(type={})";
        local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x26;
        local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_68.context_.super_basic_format_parse_context<char>._20_4_ = 1;
        local_68.parse_funcs_[0] =
             ::fmt::v10::detail::
             parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
        local_70.handler_ = &local_68;
        local_68.context_.types_ = local_68.types_;
        do {
          if (pcVar13 == "") break;
          pcVar6 = pcVar13;
          if (*pcVar13 == '{') {
LAB_001c86c0:
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
            ::writer::operator()((writer *)&local_70,pcVar13,pcVar6);
            pcVar13 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char>&>
                                (pcVar6,"",(format_string_checker<char> *)&local_68);
            bVar15 = true;
          }
          else {
            pcVar6 = pcVar13 + 1;
            bVar15 = pcVar6 != "";
            if (bVar15) {
              if (*pcVar6 != '{') {
                pcVar4 = pcVar13 + 2;
                do {
                  pcVar6 = pcVar4;
                  bVar15 = pcVar6 != "";
                  if (pcVar6 == "") goto LAB_001c86bc;
                  pcVar4 = pcVar6 + 1;
                } while (*pcVar6 != '{');
              }
              bVar15 = true;
            }
LAB_001c86bc:
            if (bVar15) goto LAB_001c86c0;
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
            ::writer::operator()((writer *)&local_70,pcVar13,"");
            bVar15 = false;
          }
        } while (bVar15);
        fmt.size_ = 2;
        fmt.data_ = (char *)0x26;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)&local_68;
        local_68.types_ = atVar8;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_f8,(v10 *)"premature end of Extended TLV(type={})",fmt,args_00);
        local_a8 = kBadFormat;
        local_a0[0] = local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a0,local_f8._M_dataplus._M_p,
                   local_f8._M_dataplus._M_p + local_f8._M_string_length);
        local_d0 = local_a8;
        std::__cxx11::string::operator=((string *)&local_c8,(string *)local_a0);
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        goto LAB_001c89a0;
      }
      uVar10 = (ulong)(ushort)(*(ushort *)(puVar7 + uVar2 + 2) << 8 |
                              *(ushort *)(puVar7 + uVar2 + 2) >> 8);
    }
    uVar12 = uVar14 + uVar10;
    local_d8 = uVar14;
    if (uVar12 <= uVar5) {
      puVar7 = (pointer)operator_new(0x30);
      puVar7[8] = '\x01';
      puVar7[9] = '\0';
      puVar7[10] = '\0';
      puVar7[0xb] = '\0';
      puVar7[0xc] = '\x01';
      puVar7[0xd] = '\0';
      puVar7[0xe] = '\0';
      puVar7[0xf] = '\0';
      *(undefined ***)puVar7 = &PTR___Sp_counted_ptr_inplace_00293b58;
      puVar7[0x10] = aScope;
      puVar7[0x11] = bVar1;
      puVar7[0x18] = '\0';
      puVar7[0x19] = '\0';
      puVar7[0x1a] = '\0';
      puVar7[0x1b] = '\0';
      puVar7[0x1c] = '\0';
      puVar7[0x1d] = '\0';
      puVar7[0x1e] = '\0';
      puVar7[0x1f] = '\0';
      puVar7[0x20] = '\0';
      puVar7[0x21] = '\0';
      puVar7[0x22] = '\0';
      puVar7[0x23] = '\0';
      puVar7[0x24] = '\0';
      puVar7[0x25] = '\0';
      puVar7[0x26] = '\0';
      puVar7[0x27] = '\0';
      puVar7[0x28] = '\0';
      puVar7[0x29] = '\0';
      puVar7[0x2a] = '\0';
      puVar7[0x2b] = '\0';
      puVar7[0x2c] = '\0';
      puVar7[0x2d] = '\0';
      puVar7[0x2e] = '\0';
      puVar7[0x2f] = '\0';
      *(pointer *)this = puVar7 + 0x10;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar7;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      puVar11 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start + local_d8;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)(puVar7 + 0x18),puVar11,
                 puVar11 + uVar10);
      goto LAB_001c89a0;
    }
    local_68.types_[0] = uint_type;
    local_68.types_[1] = uint_type;
    pcVar13 = "premature end of TLV(type={}, length={})";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "premature end of TLV(type={}, length={})";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x28;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
    local_68.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
    local_68.parse_funcs_[1] =
         ::fmt::v10::detail::
         parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>;
    local_70.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      if (pcVar13 == "") break;
      pcVar6 = pcVar13;
      if (*pcVar13 == '{') {
LAB_001c885a:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char,_unsigned_short>_>
        ::writer::operator()(&local_70,pcVar13,pcVar6);
        pcVar13 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char,unsigned_short>&>
                            (pcVar6,"",&local_68);
        bVar15 = true;
      }
      else {
        pcVar6 = pcVar13 + 1;
        bVar15 = pcVar6 != "";
        if (bVar15) {
          if (*pcVar6 != '{') {
            pcVar4 = pcVar13 + 2;
            do {
              pcVar6 = pcVar4;
              bVar15 = pcVar6 != "";
              if (pcVar6 == "") goto LAB_001c8856;
              pcVar4 = pcVar6 + 1;
            } while (*pcVar6 != '{');
          }
          bVar15 = true;
        }
LAB_001c8856:
        if (bVar15) goto LAB_001c885a;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char,_unsigned_short>_>
        ::writer::operator()(&local_70,pcVar13,"");
        bVar15 = false;
      }
    } while (bVar15);
    fmt_00.size_ = 0x22;
    fmt_00.data_ = (char *)0x28;
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)&local_68;
    local_68.types_ = atVar8;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = uVar10;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_f8,(v10 *)"premature end of TLV(type={}, length={})",fmt_00,args_01);
    local_a8 = kBadFormat;
    local_a0[0] = local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,local_f8._M_dataplus._M_p,
               local_f8._M_dataplus._M_p + local_f8._M_string_length);
    uVar12 = local_d8;
  }
  local_d0 = local_a8;
  std::__cxx11::string::operator=((string *)&local_c8,(string *)local_a0);
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
LAB_001c89a0:
  if (local_d0 == kNone) {
    *local_80 = uVar12;
  }
  else {
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    this->mScope = kMeshCoP;
    this->mType = kChannel;
    *(undefined6 *)&this->field_0x2 = 0;
    (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
  }
  local_78->mCode = local_d0;
  std::__cxx11::string::_M_assign((string *)&local_78->mMessage);
  _Var9._M_pi = extraout_RDX;
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
    _Var9._M_pi = extraout_RDX_00;
  }
  TVar16.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var9._M_pi;
  TVar16.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (TlvPtr)TVar16.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TlvPtr Tlv::Deserialize(Error &aError, size_t &aOffset, const ByteArray &aBuf, Scope aScope)
{
    Error    error;
    size_t   offset = aOffset;
    uint8_t  type;
    uint16_t length;
    TlvPtr   tlv = nullptr;

    VerifyOrExit(offset + 2 <= aBuf.size(), error = ERROR_BAD_FORMAT("premature end of TLV"));
    type   = aBuf[offset++];
    length = aBuf[offset++];
    if (length == kEscapeLength)
    {
        VerifyOrExit(offset + 2 <= aBuf.size(),
                     error = ERROR_BAD_FORMAT("premature end of Extended TLV(type={})", type));

        length = (aBuf[offset++] << 8) & 0xFF00;
        length |= (aBuf[offset++]) & 0x00FF;
    }

    VerifyOrExit(offset + length <= aBuf.size(),
                 error = ERROR_BAD_FORMAT("premature end of TLV(type={}, length={})", type, length));

    tlv = std::make_shared<Tlv>(utils::from_underlying<Type>(type), aScope);
    tlv->SetValue(&aBuf[offset], length);

    offset += length;

exit:
    if (error != ErrorCode::kNone)
    {
        tlv = nullptr;
    }
    else
    {
        aOffset = offset;
    }

    aError = error;
    return tlv;
}